

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O3

void __thiscall OpenMD::RigidBody::RigidBody(RigidBody *this)

{
  StuntDouble::StuntDouble(&this->super_StuntDouble,otRigidBody,0x1c0);
  (this->super_StuntDouble)._vptr_StuntDouble = (_func_int **)&PTR__RigidBody_002faa28;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  memset(&this->inertiaTensor_,0,0xf0);
  return;
}

Assistant:

RigidBody::RigidBody() :
      StuntDouble(otRigidBody, &Snapshot::rigidbodyData), inertiaTensor_(0.0) {}